

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O1

ostream * __thiscall
pstack::Procman::Process::dumpFrameText(Process *this,ostream *os,StackFrame *frame,int frameNo)

{
  long *plVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ostream oVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long lVar9;
  DIE *pDVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char *__s;
  StackFrame *die;
  ostream *poVar12;
  sptr sVar13;
  undefined1 local_300 [8];
  IOFlagSave _;
  PrintableFrame pframe;
  undefined1 local_190 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  long local_168;
  long *local_160;
  undefined1 auStack_158 [8];
  MaybeNamedSymbol sym;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  ProcessLocation location;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  source;
  undefined1 local_b8 [8];
  string name;
  undefined1 auStack_90 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> src;
  undefined1 local_60 [8];
  string flags;
  
  IOFlagSave::IOFlagSave((IOFlagSave *)local_300,(ios *)(os + *(long *)(*(long *)os + -0x18)));
  PrintableFrame::PrintableFrame((PrintableFrame *)&_.field_0x108,this,frame);
  StackFrame::scopeIP((ProcessLocation *)local_f0,frame,this);
  location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  source.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  flags.field_2._8_8_ = this;
  if (this->context[0x88] == (Context)0x0) {
    ProcessLocation::source_abi_cxx11_
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)auStack_90,(ProcessLocation *)local_f0);
    auStack_158 = (undefined1  [8])
                  location.codeloc.
                  super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
    location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_90;
    source.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)src.first._M_dataplus._M_p;
    sym.
    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload._0_8_ = 0;
    sym.
    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_payload._M_value.first.st_value = 0;
    auStack_90 = (undefined1  [8])0x0;
    src.first._M_dataplus._M_p = (pointer)0x0;
    src.first._M_string_length = 0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)auStack_158);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)auStack_90);
  }
  _Var2._M_pi = location.codeloc.
                super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)frame;
  if (source.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pointer)location.codeloc.
               super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_90,"",(allocator<char> *)auStack_158);
    src.first.field_2._8_4_ = 0xffffffff;
  }
  else {
    auStack_90 = (undefined1  [8])&src.first._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_90,
               (location.codeloc.
                super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_vptr__Sp_counted_base,
               *(long *)&(location.codeloc.
                          super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count +
               (long)(location.codeloc.
                      super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_vptr__Sp_counted_base);
    src.first.field_2._8_4_ = *(undefined4 *)&_Var2._M_pi[2]._vptr__Sp_counted_base;
  }
  die = (StackFrame *)
        pframe.inlined.super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>.
        _M_impl.super__Vector_impl_data._M_start;
  if (*(char *)(*(long *)(flags.field_2._8_8_ + 0xa0) + 0x8c) == '\0') {
    while (die != pframe.frame) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"#",1);
      lVar9 = *(long *)os;
      *(uint *)(os + *(long *)(lVar9 + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(lVar9 + -0x18) + 0x18) & 0xffffff4f | 0x20;
      *(undefined8 *)(os + *(long *)(lVar9 + -0x18) + 0x10) = 2;
      poVar5 = os + *(long *)(lVar9 + -0x18);
      if (os[*(long *)(lVar9 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar5);
        poVar5[0xe0] = oVar3;
        poVar5[0xe1] = (ostream)0x1;
      }
      poVar5[0xe0] = (ostream)0x20;
      poVar5 = (ostream *)std::ostream::operator<<(os,frameNo);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      lVar9 = *(long *)poVar5;
      *(undefined8 *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x10) = 0x12;
      lVar9 = *(long *)(lVar9 + -0x18);
      poVar12 = poVar5 + lVar9;
      if (poVar5[lVar9 + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar12);
        poVar12[0xe0] = oVar3;
        poVar12[0xe1] = (ostream)0x1;
      }
      poVar12[0xe0] = (ostream)0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"inlined",7);
      std::__ostream_insert<char,std::char_traits<char>>(os," in ",4);
      die = (StackFrame *)&die[-1].regs.es;
      buildDIEName(os,(DIE *)die,true);
      if ((*(char *)(*(long *)(flags.field_2._8_8_ + 0xa0) + 0x88) == '\0') &&
         (plVar6 = (long *)pstack::Dwarf::Unit::getLines(), *plVar6 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," at ",4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(char *)auStack_90,(long)src.first._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
        std::ostream::operator<<(poVar5,src.first.field_2._8_4_);
        lVar9 = *plVar6;
        pstack::Dwarf::DIE::attribute((AttrName)auStack_158,SUB81(die,0));
        src.second = frameNo;
        lVar7 = pstack::Dwarf::DIE::Attribute::operator_cast_to_long((Attribute *)auStack_158);
        local_168 = *(long *)(lVar9 + 0x38);
        plVar1 = (long *)(local_168 + lVar7 * 0x30);
        Dwarf::DIE::~DIE((DIE *)auStack_158);
        src._36_4_ = *(int *)(*(long *)(flags.field_2._8_8_ + 0xa0) + 0xa0);
        if (src._36_4_ == 0) {
          local_60 = (undefined1  [8])&flags._M_string_length;
          std::__cxx11::string::_M_construct<char*>((string *)local_60,*plVar1,plVar1[1] + *plVar1);
          frameNo = src.second;
        }
        else {
          lVar7 = (ulong)*(uint *)(local_168 + (lVar7 * 3 + 2) * 0x10) * 0x20;
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          lVar9 = *(long *)(*(long *)(*plVar6 + 0x20) + lVar7);
          local_160 = plVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,lVar9,
                     *(long *)(*(long *)(*plVar6 + 0x20) + 8 + lVar7) + lVar9);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_110,"/");
          frameNo = src.second;
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_110,(char *)*local_160,local_160[1]);
          local_60 = (undefined1  [8])(pbVar8->_M_dataplus)._M_p;
          paVar11 = &pbVar8->field_2;
          if (local_60 == (undefined1  [8])paVar11) {
            flags._M_string_length = paVar11->_M_allocated_capacity;
            flags.field_2._M_allocated_capacity = *(size_type *)((long)&pbVar8->field_2 + 8);
            local_60 = (undefined1  [8])&flags._M_string_length;
          }
          else {
            flags._M_string_length = paVar11->_M_allocated_capacity;
          }
          flags._M_dataplus._M_p = (pointer)pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
        }
        if ((src._36_4_ != 0) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2)) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        pstack::Dwarf::DIE::attribute((AttrName)(Attribute *)auStack_158,SUB81(die,0));
        lVar9 = pstack::Dwarf::DIE::Attribute::operator_cast_to_long((Attribute *)auStack_158);
        local_b8 = (undefined1  [8])&name._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,local_60,flags._M_dataplus._M_p + (long)local_60);
        name.field_2._8_8_ = lVar9;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
        src.first.field_2._8_4_ = name.field_2._8_4_;
        if (local_b8 != (undefined1  [8])&name._M_string_length) {
          operator_delete((void *)local_b8,
                          CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length) +
                          1);
        }
        Dwarf::DIE::~DIE((DIE *)auStack_158);
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        if (local_60 != (undefined1  [8])&flags._M_string_length) {
          operator_delete((void *)local_60,flags._M_string_length + 1);
        }
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"#",1);
  _Var2._M_pi = local_170._M_pi;
  lVar9 = *(long *)os;
  *(uint *)(os + *(long *)(lVar9 + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(lVar9 + -0x18) + 0x18) & 0xffffff4f | 0x20;
  *(undefined8 *)(os + *(long *)(lVar9 + -0x18) + 0x10) = 2;
  poVar5 = os + *(long *)(lVar9 + -0x18);
  if (os[*(long *)(lVar9 + -0x18) + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar5);
    poVar5[0xe0] = oVar3;
    poVar5[0xe1] = (ostream)0x1;
  }
  poVar5[0xe0] = (ostream)0x20;
  poVar5 = (ostream *)std::ostream::operator<<(os,frameNo);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0x",2);
  lVar9 = *(long *)poVar5;
  *(uint *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x10) = 0x10;
  poVar12 = poVar5 + *(long *)(lVar9 + -0x18);
  if (poVar5[*(long *)(lVar9 + -0x18) + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar12);
    poVar12[0xe0] = oVar3;
    poVar12[0xe1] = (ostream)0x1;
  }
  poVar12[0xe0] = (ostream)0x30;
  StackFrame::rawIP((StackFrame *)_Var2._M_pi);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
  if (location.location_ == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," no information for frame",0x19);
  }
  else {
    name._M_dataplus._M_p = (pointer)0x0;
    name._M_string_length._0_1_ = 0;
    local_b8 = (undefined1  [8])&name._M_string_length;
    local_60 = (undefined1  [8])&flags._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"");
    if (*(bool *)((long)&_Var2._M_pi[0xe]._vptr__Sp_counted_base + 4) == true) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,"*");
    }
    ProcessLocation::symbol_abi_cxx11_((MaybeNamedSymbol *)auStack_158,(ProcessLocation *)local_f0);
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pframe,
                       "");
    if (iVar4 == 0) {
      if (sym.
          super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_payload._48_1_ == '\x01') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&sym.
                           super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_payload._M_value.first + 0x10));
        if (location.location_ == 0) {
          pDVar10 = (DIE *)&Dwarf::DIE::null;
        }
        else {
          pDVar10 = CodeLocation::die((CodeLocation *)location.location_);
        }
        __s = "%";
        if ((pDVar10->raw).super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == (element_type *)0x0) {
          __s = "!";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,__s
                  );
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,0,
                   (size_type)name._M_dataplus._M_p,"<unknown>",9);
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pframe);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os," in ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(char *)local_b8,(long)name._M_dataplus._M_p);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_60,(long)flags._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
    pframe.inlined.super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)flags.field_2._8_8_;
    Procman::operator<<(poVar5,(ArgPrint *)
                               &pframe.inlined.
                                super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
    if (pframe.dieName.field_2._8_8_ != -1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"+",1);
      std::ostream::_M_insert<unsigned_long>((ulong)os);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os," in ",4);
    sVar13 = ProcessLocation::elf((ProcessLocation *)(local_190 + 0x10));
    stringify<pstack::Reader_const&>
              ((string *)
               &pframe.inlined.
                super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (pstack *)
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_190._16_8_ + 0x40))->
               _vptr__Sp_counted_base,
               (Reader *)
               sVar13.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(char *)pframe.inlined.
                          super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)_Var2._M_pi);
    if (pframe.inlined.super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_190) {
      operator_delete(pframe.inlined.
                      super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,local_190._0_8_ + 1);
    }
    if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
    }
    if (*(int *)(*(long *)(flags.field_2._8_8_ + 0xa0) + 0xa0) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"@0x",3);
      *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
      StackFrame::rawIP((StackFrame *)_Var2._M_pi);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    }
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_90,"");
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os," at ",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)auStack_90,(long)src.first._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::ostream::operator<<(poVar5,src.first.field_2._8_4_);
    }
    if ((sym.
         super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_payload._48_1_ == '\x01') &&
       (sym.
        super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_payload._48_1_ = 0,
       (undefined1 *)
       sym.
       super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_payload._M_value.first.st_size !=
       (undefined1 *)
       ((long)&sym.
               super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_payload + 0x20))) {
      operator_delete((void *)sym.
                              super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_payload._M_value.first.st_size,
                      sym.
                      super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_payload._M_value.second._M_string_length + 1);
    }
    if (local_60 != (undefined1  [8])&flags._M_string_length) {
      operator_delete((void *)local_60,flags._M_string_length + 1);
    }
    if (local_b8 != (undefined1  [8])&name._M_string_length) {
      operator_delete((void *)local_b8,
                      CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length) + 1);
    }
  }
  if (*(int *)(*(long *)(flags.field_2._8_8_ + 0xa0) + 0xa0) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," via ",5);
    Procman::operator<<(os,*(UnwindMechanism *)&_Var2._M_pi[0xe]._vptr__Sp_counted_base);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  if (auStack_90 != (undefined1  [8])&src.first._M_string_length) {
    operator_delete((void *)auStack_90,src.first._M_string_length + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)&location.codeloc.
                super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  if (location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               location.codeloc.
               super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>::~vector
            ((vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_> *)&pframe.frame);
  if (pframe.proc != (Process *)&pframe.dieName._M_string_length) {
    operator_delete(pframe.proc,pframe.dieName._M_string_length + 1);
  }
  IOFlagSave::~IOFlagSave((IOFlagSave *)local_300);
  return os;
}

Assistant:

std::ostream &
Process::dumpFrameText(std::ostream &os, const StackFrame &frame, int frameNo)
{
    IOFlagSave _(os);
    PrintableFrame pframe(*this, frame);

    ProcessLocation location = frame.scopeIP(*this);
    std::vector<std::pair<std::string, int>> source;

    if (!context.options.nosrc)
        source = location.source();

    std::pair<std::string, int> src = source.size()
        ? source[0]
        : std::make_pair( "", std::numeric_limits<Elf::Addr>::max());

    if (!context.options.nodienames) {
        // inlining comes from DIEs with DW_TAG_inlined_subroutine - so no
        // point in trying this without DIE names
        for (auto i = pframe.inlined.rbegin(); i != pframe.inlined.rend(); ++i) {
           os << "#"
               << std::left << std::setw(2) << std::setfill(' ') << frameNo << " "
               << std::setw(ELF_BITS/4 + 2) << std::setfill(' ')
               << "inlined";
           os << " in ";
           buildDIEName(os, *i);
           if (!context.options.nosrc) {
               const auto &lineinfo = i->getUnit()->getLines();
               if (lineinfo) {
                  os << " at " << src.first << ":" << src.second;
                  auto &fileEnt = lineinfo->files[intmax_t(i->attribute(Dwarf::DW_AT_call_file))];
                  auto &dirname = lineinfo->directories[fileEnt.dirindex];
                  const auto &name = context.verbose ? dirname + "/" + fileEnt.name : fileEnt.name;
                  src = std::make_pair( name, intmax_t(i->attribute(Dwarf::DW_AT_call_line)));
                  os << "\n";
               }
           }
        }
    }

    os << "#"
        << std::left << std::setw(2) << std::setfill(' ') << frameNo << " "
        << std::right << "0x" << std::hex << std::setw(ELF_BITS/4) << std::setfill('0')
        << frame.rawIP() << std::dec;

    if (location.inObject()) {
        std::string name;
        std::string flags = "";
        if (frame.isSignalTrampoline)
            flags += "*";

        auto sym = location.symbol();
        if (pframe.dieName != "") {
            name = pframe.dieName;
        } else if (sym) {
            name = sym->second;
            flags += location.die() ? "%" : "!";
        } else {
            name = "<unknown>";
        }
        os << " in "
            << name
            << flags
            << "(" << ArgPrint(*this, frame) << ")";

        if (pframe.functionOffset != std::numeric_limits<Elf::Addr>::max())
            os << "+" << pframe.functionOffset;
        os << " in " << stringify(*location.elf()->io);
        if (context.verbose)
           os << "@0x" << std::hex << frame.rawIP() - location.elfReloc() << std::dec;
        if (src.first != "")
           os << " at " << src.first << ":" << std::dec << src.second;
    } else {
        os << " no information for frame";
    }
    if (context.verbose)
       os << " via " << frame.mechanism;
    os << "\n";
    return os;
}